

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ym3438.c
# Opt level: O0

void NOPN2_DoRegWrite(ym3438_t *chip)

{
  uint uVar1;
  ushort uVar2;
  bool local_39;
  Bit32u channel;
  Bit32u address;
  Bit32u slot;
  Bit32u i;
  ym3438_t *chip_local;
  
  channel = chip->cycles % 0xc;
  uVar1 = chip->channel;
  if (chip->write_fm_data != '\0') {
    if (op_offset[channel] == (chip->address & 0x107)) {
      if ((chip->address & 8) != 0) {
        channel = channel + 0xc;
      }
      uVar2 = chip->address & 0xf0;
      if (uVar2 == 0x30) {
        chip->multi[channel] = chip->data & 0xf;
        if (chip->multi[channel] == '\0') {
          chip->multi[channel] = '\x01';
        }
        else {
          chip->multi[channel] = chip->multi[channel] << 1;
        }
        chip->dt[channel] = (byte)((int)(uint)chip->data >> 4) & 7;
      }
      else if (uVar2 == 0x40) {
        chip->tl[channel] = chip->data & 0x7f;
      }
      else if (uVar2 == 0x50) {
        chip->ar[channel] = chip->data & 0x1f;
        chip->ks[channel] = (Bit8u)((int)(uint)chip->data >> 6);
      }
      else if (uVar2 == 0x60) {
        chip->dr[channel] = chip->data & 0x1f;
        chip->am[channel] = (Bit8u)((int)(uint)chip->data >> 7);
      }
      else if (uVar2 == 0x70) {
        chip->sr[channel] = chip->data & 0x1f;
      }
      else if (uVar2 == 0x80) {
        chip->rr[channel] = chip->data & 0xf;
        chip->sl[channel] = (Bit8u)((int)(uint)chip->data >> 4);
        chip->sl[channel] = chip->sl[channel] | chip->sl[channel] + 1 & 0x10;
      }
      else if (uVar2 == 0x90) {
        chip->ssg_eg[channel] = chip->data & 0xf;
      }
    }
    if (ch_offset[uVar1] == (chip->address & 0x103)) {
      switch(chip->address & 0xfc) {
      case 0xa0:
        chip->fnum[uVar1] = (ushort)chip->data | (chip->reg_a4 & 7) << 8;
        chip->block[uVar1] = (byte)((int)(uint)chip->reg_a4 >> 3) & 7;
        chip->kcode[uVar1] =
             chip->block[uVar1] << 2 | (byte)fn_note[(int)(uint)chip->fnum[uVar1] >> 7];
        break;
      case 0xa4:
        chip->reg_a4 = chip->data;
        break;
      case 0xa8:
        chip->fnum_3ch[uVar1] = (ushort)chip->data | (chip->reg_ac & 7) << 8;
        chip->block_3ch[uVar1] = (byte)((int)(uint)chip->reg_ac >> 3) & 7;
        chip->kcode_3ch[uVar1] =
             chip->block_3ch[uVar1] << 2 | (byte)fn_note[(int)(uint)chip->fnum_3ch[uVar1] >> 7];
        break;
      case 0xac:
        chip->reg_ac = chip->data;
        break;
      case 0xb0:
        chip->connect[uVar1] = chip->data & 7;
        chip->fb[uVar1] = (byte)((int)(uint)chip->data >> 3) & 7;
        break;
      case 0xb4:
        chip->pms[uVar1] = chip->data & 7;
        chip->ams[uVar1] = (byte)((int)(uint)chip->data >> 4) & 3;
        chip->pan_l[uVar1] = (Bit8u)((int)(uint)chip->data >> 7);
        chip->pan_r[uVar1] = (byte)((int)(uint)chip->data >> 6) & 1;
      }
    }
  }
  if ((chip->write_a_en != '\0') || (chip->write_d_en != '\0')) {
    if (chip->write_a_en != '\0') {
      chip->write_fm_data = '\0';
    }
    if ((chip->write_fm_address != '\0') && (chip->write_d_en != '\0')) {
      chip->write_fm_data = '\x01';
    }
    if (chip->write_a_en != '\0') {
      if ((chip->write_data & 0xf0) == 0) {
        chip->write_fm_address = '\0';
      }
      else {
        chip->address = chip->write_data;
        chip->write_fm_address = '\x01';
      }
    }
    if ((chip->write_d_en != '\0') && ((chip->write_data & 0x100) == 0)) {
      switch(chip->write_fm_mode_a) {
      case 0x21:
        for (address = 0; address < 8; address = address + 1) {
          chip->mode_test_21[address] =
               (byte)((int)(uint)chip->write_data >> ((byte)address & 0x1f)) & 1;
        }
        break;
      case 0x22:
        if (((int)(uint)chip->write_data >> 3 & 1U) == 0) {
          chip->lfo_en = '\0';
        }
        else {
          chip->lfo_en = '\x7f';
        }
        chip->lfo_freq = (byte)chip->write_data & 7;
        break;
      default:
        break;
      case 0x24:
        chip->timer_a_reg = chip->timer_a_reg & 3;
        chip->timer_a_reg = chip->timer_a_reg | (chip->write_data & 0xff) << 2;
        break;
      case 0x25:
        chip->timer_a_reg = chip->timer_a_reg & 0x3fc;
        chip->timer_a_reg = chip->timer_a_reg | chip->write_data & 3;
        break;
      case 0x26:
        chip->timer_b_reg = chip->write_data & 0xff;
        break;
      case 0x27:
        chip->mode_ch3 = (Bit8u)((int)(chip->write_data & 0xc0) >> 6);
        chip->mode_csm = chip->mode_ch3 == '\x02';
        chip->timer_a_load = (byte)chip->write_data & 1;
        chip->timer_a_enable = (byte)((int)(uint)chip->write_data >> 2) & 1;
        chip->timer_a_reset = (byte)((int)(uint)chip->write_data >> 4) & 1;
        chip->timer_b_load = (byte)((int)(uint)chip->write_data >> 1) & 1;
        chip->timer_b_enable = (byte)((int)(uint)chip->write_data >> 3) & 1;
        chip->timer_b_reset = (byte)((int)(uint)chip->write_data >> 5) & 1;
        break;
      case 0x28:
        for (address = 0; address < 4; address = address + 1) {
          chip->mode_kon_operator[address] =
               (byte)((int)(uint)chip->write_data >> ((char)address + 4U & 0x1f)) & 1;
        }
        if ((chip->write_data & 3) == 3) {
          chip->mode_kon_channel = 0xff;
        }
        else {
          chip->mode_kon_channel =
               ((byte)chip->write_data & 3) +
               ((byte)((int)(uint)chip->write_data >> 2) & 1) * '\x03';
        }
        break;
      case 0x2a:
        chip->dacdata = chip->dacdata & 1;
        chip->dacdata = chip->dacdata | (chip->write_data ^ 0x80) << 1;
        break;
      case 0x2b:
        chip->dacen = (Bit8u)((int)(uint)chip->write_data >> 7);
        break;
      case 0x2c:
        for (address = 0; address < 8; address = address + 1) {
          chip->mode_test_2c[address] =
               (byte)((int)(uint)chip->write_data >> ((byte)address & 0x1f)) & 1;
        }
        chip->dacdata = chip->dacdata & 0x1fe;
        chip->dacdata = chip->dacdata | (ushort)chip->mode_test_2c[3];
        local_39 = false;
        if (chip->mode_test_2c[7] == '\0') {
          local_39 = chip->mode_test_2c[6] != '\0';
        }
        chip->eg_custom_timer = local_39;
      }
    }
    if (chip->write_a_en != '\0') {
      chip->write_fm_mode_a = chip->write_data & 0x1ff;
    }
  }
  if (chip->write_fm_data != '\0') {
    chip->data = (Bit8u)chip->write_data;
  }
  return;
}

Assistant:

void NOPN2_DoRegWrite(ym3438_t *chip)
{
    Bit32u i;
    Bit32u slot = chip->cycles % 12;
    Bit32u address;
    Bit32u channel = chip->channel;
    /* Update registers */
    if (chip->write_fm_data)
    {
        /* Slot */
        if (op_offset[slot] == (chip->address & 0x107))
        {
            if (chip->address & 0x08)
            {
                /* OP2, OP4 */
                slot += 12;
            }
            address = chip->address & 0xf0;
            switch (address)
            {
            case 0x30: /* DT, MULTI */
                chip->multi[slot] = chip->data & 0x0f;
                if (!chip->multi[slot])
                {
                    chip->multi[slot] = 1;
                }
                else
                {
                    chip->multi[slot] <<= 1;
                }
                chip->dt[slot] = (chip->data >> 4) & 0x07;
                break;
            case 0x40: /* TL */
                chip->tl[slot] = chip->data & 0x7f;
                break;
            case 0x50: /* KS, AR */
                chip->ar[slot] = chip->data & 0x1f;
                chip->ks[slot] = (chip->data >> 6) & 0x03;
                break;
            case 0x60: /* AM, DR */
                chip->dr[slot] = chip->data & 0x1f;
                chip->am[slot] = (chip->data >> 7) & 0x01;
                break;
            case 0x70: /* SR */
                chip->sr[slot] = chip->data & 0x1f;
                break;
            case 0x80: /* SL, RR */
                chip->rr[slot] = chip->data & 0x0f;
                chip->sl[slot] = (chip->data >> 4) & 0x0f;
                chip->sl[slot] |= (chip->sl[slot] + 1) & 0x10;
                break;
            case 0x90: /* SSG-EG */
                chip->ssg_eg[slot] = chip->data & 0x0f;
                break;
            default:
                break;
            }
        }

        /* Channel */
        if (ch_offset[channel] == (chip->address & 0x103))
        {
            address = chip->address & 0xfc;
            switch (address)
            {
            case 0xa0:
                chip->fnum[channel] = (chip->data & 0xff) | ((chip->reg_a4 & 0x07) << 8);
                chip->block[channel] = (chip->reg_a4 >> 3) & 0x07;
                chip->kcode[channel] = (chip->block[channel] << 2) | fn_note[chip->fnum[channel] >> 7];
                break;
            case 0xa4:
                chip->reg_a4 = chip->data & 0xff;
                break;
            case 0xa8:
                chip->fnum_3ch[channel] = (chip->data & 0xff) | ((chip->reg_ac & 0x07) << 8);
                chip->block_3ch[channel] = (chip->reg_ac >> 3) & 0x07;
                chip->kcode_3ch[channel] = (chip->block_3ch[channel] << 2) | fn_note[chip->fnum_3ch[channel] >> 7];
                break;
            case 0xac:
                chip->reg_ac = chip->data & 0xff;
                break;
            case 0xb0:
                chip->connect[channel] = chip->data & 0x07;
                chip->fb[channel] = (chip->data >> 3) & 0x07;
                break;
            case 0xb4:
                chip->pms[channel] = chip->data & 0x07;
                chip->ams[channel] = (chip->data >> 4) & 0x03;
                chip->pan_l[channel] = (chip->data >> 7) & 0x01;
                chip->pan_r[channel] = (chip->data >> 6) & 0x01;
                break;
            default:
                break;
            }
        }
    }

    if (chip->write_a_en || chip->write_d_en)
    {
        /* Data */
        if (chip->write_a_en)
        {
            chip->write_fm_data = 0;
        }

        if (chip->write_fm_address && chip->write_d_en)
        {
            chip->write_fm_data = 1;
        }

        /* Address */
        if (chip->write_a_en)
        {
            if ((chip->write_data & 0xf0) != 0x00)
            {
                /* FM Write */
                chip->address = chip->write_data;
                chip->write_fm_address = 1;
            }
            else
            {
                /* SSG write */
                chip->write_fm_address = 0;
            }
        }

        /* FM Mode */
        /* Data */
        if (chip->write_d_en && (chip->write_data & 0x100) == 0)
        {
            switch (chip->write_fm_mode_a)
            {
            case 0x21: /* LSI test 1 */
                for (i = 0; i < 8; i++)
                {
                    chip->mode_test_21[i] = (chip->write_data >> i) & 0x01;
                }
                break;
            case 0x22: /* LFO control */
                if ((chip->write_data >> 3) & 0x01)
                {
                    chip->lfo_en = 0x7f;
                }
                else
                {
                    chip->lfo_en = 0;
                }
                chip->lfo_freq = chip->write_data & 0x07;
                break;
            case 0x24: /* Timer A */
                chip->timer_a_reg &= 0x03;
                chip->timer_a_reg |= (chip->write_data & 0xff) << 2;
                break;
            case 0x25:
                chip->timer_a_reg &= 0x3fc;
                chip->timer_a_reg |= chip->write_data & 0x03;
                break;
            case 0x26: /* Timer B */
                chip->timer_b_reg = chip->write_data & 0xff;
                break;
            case 0x27: /* CSM, Timer control */
                chip->mode_ch3 = (chip->write_data & 0xc0) >> 6;
                chip->mode_csm = chip->mode_ch3 == 2;
                chip->timer_a_load = chip->write_data & 0x01;
                chip->timer_a_enable = (chip->write_data >> 2) & 0x01;
                chip->timer_a_reset = (chip->write_data >> 4) & 0x01;
                chip->timer_b_load = (chip->write_data >> 1) & 0x01;
                chip->timer_b_enable = (chip->write_data >> 3) & 0x01;
                chip->timer_b_reset = (chip->write_data >> 5) & 0x01;
                break;
            case 0x28: /* Key on/off */
                for (i = 0; i < 4; i++)
                {
                    chip->mode_kon_operator[i] = (chip->write_data >> (4 + i)) & 0x01;
                }
                if ((chip->write_data & 0x03) == 0x03)
                {
                    /* Invalid address */
                    chip->mode_kon_channel = 0xff;
                }
                else
                {
                    chip->mode_kon_channel = (chip->write_data & 0x03) + ((chip->write_data >> 2) & 1) * 3;
                }
                break;
            case 0x2a: /* DAC data */
                chip->dacdata &= 0x01;
                chip->dacdata |= (chip->write_data ^ 0x80) << 1;
                break;
            case 0x2b: /* DAC enable */
                chip->dacen = chip->write_data >> 7;
                break;
            case 0x2c: /* LSI test 2 */
                for (i = 0; i < 8; i++)
                {
                    chip->mode_test_2c[i] = (chip->write_data >> i) & 0x01;
                }
                chip->dacdata &= 0x1fe;
                chip->dacdata |= chip->mode_test_2c[3];
                chip->eg_custom_timer = !chip->mode_test_2c[7] && chip->mode_test_2c[6];
                break;
            default:
                break;
            }
        }

        /* Address */
        if (chip->write_a_en)
        {
            chip->write_fm_mode_a = chip->write_data & 0x1ff;
        }
    }

    if (chip->write_fm_data)
    {
        chip->data = chip->write_data & 0xff;
    }
}